

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int sintf1_(int *n,int *inc,double *x,double *wsave,double *xh,double *work,int *ier)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  int lnxh;
  int np1;
  int *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  int lnsv;
  int lnwk;
  int ier1;
  
  iVar4 = *inc;
  uVar8 = (ulong)iVar4;
  *ier = 0;
  uVar2 = *n;
  uVar10 = (ulong)uVar2;
  if (1 < (int)uVar2) {
    uVar6 = ~uVar8;
    local_58 = x + uVar6;
    if (uVar2 == 2) {
      dVar14 = *x;
      iVar4 = iVar4 * 2 + 1;
      dVar15 = local_58[iVar4];
      local_58[iVar4] = (dVar14 - dVar15) * 0.5773502691896258;
      *x = (dVar14 + dVar15) * 0.5773502691896258;
    }
    else {
      local_50 = wsave + -1;
      uVar12 = uVar2 + 1;
      uVar13 = uVar2 >> 1;
      lVar5 = uVar6 + uVar8 + 1;
      lVar7 = uVar6 + uVar10 * uVar8 + 1;
      lVar11 = 1;
      do {
        dVar15 = x[lVar5] - x[lVar7];
        dVar14 = (x[lVar5] + x[lVar7]) * wsave[lVar11 + -1];
        xh[lVar11] = dVar15 + dVar14;
        lVar1 = (1 - (ulong)(uVar2 >> 1)) + lVar11;
        lVar11 = lVar11 + 1;
        xh[uVar10] = dVar14 - dVar15;
        lVar5 = lVar5 + uVar8;
        uVar10 = uVar10 - 1;
        lVar7 = lVar7 - uVar8;
      } while (lVar1 != 1);
      if ((uVar2 & 1) != 0) {
        xh[(ulong)uVar13 + 1] = local_58[(long)(int)((uVar13 + 1) * iVar4) + 1] * 4.0;
      }
      *xh = 0.0;
      lnxh = uVar12;
      np1 = uVar12;
      local_60 = n;
      local_48 = work;
      dVar14 = log((double)(int)uVar12);
      lnsv = (int)(dVar14 / 0.6931471805599453) + uVar2 + 5;
      lnwk = uVar12;
      rfft1f_(&np1,&c__1,xh,&lnxh,local_50 + (ulong)uVar13 + 1,&lnsv,local_48,&lnwk,&ier1);
      if (ier1 == 0) {
        if ((uVar2 & 1) != 0) {
          xh[(ulong)uVar12 - 1] = xh[(ulong)uVar12 - 1] + xh[(ulong)uVar12 - 1];
        }
        dVar14 = *xh * 0.5;
        *x = dVar14;
        iVar3 = *local_60;
        uVar10 = (ulong)iVar3;
        if (2 < (long)uVar10) {
          pdVar9 = local_58 + 1;
          uVar6 = 3;
          do {
            pdVar9[uVar8 * 2] = xh[uVar6 - 1] * 0.5;
            dVar14 = dVar14 + xh[uVar6 - 2] * 0.5;
            pdVar9[uVar8 * 3] = dVar14;
            pdVar9 = pdVar9 + uVar8 * 2;
            uVar6 = uVar6 + 2;
          } while (uVar6 <= uVar10);
        }
        if ((uVar2 & 1) == 0) {
          local_58[(long)(iVar4 * iVar3) + 1] = xh[uVar10] * 0.5;
        }
      }
      else {
        *ier = 0x14;
      }
    }
  }
  return 0;
}

Assistant:

int sintf1_(int *n, int *inc, fft_real_t *x, fft_real_t *wsave,
	fft_real_t *xh, fft_real_t *work, int *ier)
{
    /* System generated locals */
    int x_dim1, x_offset, i__1;

    /* Builtin functions */

    /* Local variables */
     int i__, k;
     fft_real_t t1, t2;
     int kc, np1, ns2, ier1, modn;
     fft_real_t dsum;
     int lnxh, lnwk, lnsv;
     fft_real_t sfnp1, xhold;
    extern /* Subroutine */ int rfft1f_(int *, int *, fft_real_t *, int
	    *, fft_real_t *, int *, fft_real_t *, int *, int *);
     fft_real_t ssqrt3;
    extern /* Subroutine */ int xerfft_(char *, int *, ftnlen);

    /* Parameter adjustments */
    x_dim1 = *inc;
    x_offset = 1 + x_dim1;
    x -= x_offset;
    --wsave;
    --xh;

    /* Function Body */
    *ier = 0;
    if ((i__1 = *n - 2) < 0) {
	goto L200;
    } else if (i__1 == 0) {
	goto L102;
    } else {
	goto L103;
    }
L102:
    ssqrt3 = 1.0 / sqrt(3.0);
    xhold = ssqrt3 * (x[x_dim1 + 1] + x[(x_dim1 << 1) + 1]);
    x[(x_dim1 << 1) + 1] = ssqrt3 * (x[x_dim1 + 1] - x[(x_dim1 << 1) + 1]);
    x[x_dim1 + 1] = xhold;
    goto L200;
L103:
    np1 = *n + 1;
    ns2 = *n / 2;
    i__1 = ns2;
    for (k = 1; k <= i__1; ++k) {
	kc = np1 - k;
	t1 = x[k * x_dim1 + 1] - x[kc * x_dim1 + 1];
	t2 = wsave[k] * (x[k * x_dim1 + 1] + x[kc * x_dim1 + 1]);
	xh[k + 1] = t1 + t2;
	xh[kc + 1] = t2 - t1;
/* L104: */
    }
    modn = *n % 2;
    if (modn == 0) {
	goto L124;
    }
    xh[ns2 + 2] = x[(ns2 + 1) * x_dim1 + 1] * 4.0;
L124:
    xh[1] = 0.0;
    lnxh = np1;
    lnsv = np1 + (int) (log((fft_real_t) np1) / log(2.0)) + 4;
    lnwk = np1;

    rfft1f_(&np1, &c__1, &xh[1], &lnxh, &wsave[ns2 + 1], &lnsv, work, &lnwk, &
	    ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("SINTF1", &c_n5, (ftnlen)6);
	goto L200;
    }

    if (np1 % 2 != 0) {
	goto L30;
    }
    xh[np1] += xh[np1];
L30:
    sfnp1 = 1.0 / (fft_real_t) np1;
    x[x_dim1 + 1] = xh[1] * .5;
    dsum = x[x_dim1 + 1];
    i__1 = *n;
    for (i__ = 3; i__ <= i__1; i__ += 2) {
	x[(i__ - 1) * x_dim1 + 1] = xh[i__] * .5;
	dsum += xh[i__ - 1] * .5;
	x[i__ * x_dim1 + 1] = dsum;
/* L105: */
    }
    if (modn != 0) {
	goto L200;
    }
    x[*n * x_dim1 + 1] = xh[*n + 1] * .5;
L200:
    return 0;
}